

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O1

void __thiscall helics::helicsCLI11App::add_config_validation(helicsCLI11App *this)

{
  Option *pOVar1;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"--config","");
  pOVar1 = CLI::App::get_option(&this->super_App,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (pOVar1 != (Option *)0x0) {
    (this->super_App).validate_positionals_ = true;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_80 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:163:24)>
               ::_M_invoke;
    local_88 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/../core/helicsCLI11.hpp:163:24)>
               ::_M_manager;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    std::vector<CLI::Validator,std::allocator<CLI::Validator>>::
    emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&,std::__cxx11::string,std::__cxx11::string>
              ((vector<CLI::Validator,std::allocator<CLI::Validator>> *)&pOVar1->validators_,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_98,&local_58,&local_78);
    (pOVar1->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
    _M_impl.super__Vector_impl_data._M_finish[-1].non_modifying_ = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
  }
  return;
}

Assistant:

void add_config_validation()
    {
        auto* opt = get_option("--config");
        if (opt != nullptr) {
            validate_positionals();
            opt->check([](const std::string& fname) {
                static const std::set<std::string> validExt = {
                    ".ini", ".toml", ".json", ".INI", ".JSON", ".TOML"};
                auto ext = std::filesystem::path(fname).extension().string();
                if (validExt.find(ext) == validExt.end()) {
                    return fname + " does not have a valid extension";
                }
                return std::string{};
            });
        }
    }